

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O0

void print_code_segment_info(code_segment sec)

{
  uint local_24;
  int i;
  code_pointer code_segment_addr;
  code_segment sec_local;
  
  for (local_24 = 0; local_24 < sec.code_segment_count; local_24 = local_24 + 1) {
    printf("  - code[%d]: size=%lu\n",(ulong)local_24,sec.code_segment_addr[(int)local_24].code_size
          );
    print_instructions(&sec.code_segment_addr[(int)local_24].inst,0,false);
  }
  return;
}

Assistant:

void print_code_segment_info(code_segment sec) {
    code_pointer code_segment_addr;
    for (int i = 0; i < sec.code_segment_count; ++i) {
        code_segment_addr = sec.code_segment_addr + i;
        printf("  - code[%d]: size=%lu\n", i, code_segment_addr->code_size);
#ifdef PRINT_CODE
        print_instructions(&code_segment_addr->inst, 0, false);
#endif
    }
}